

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O1

void __thiscall mailManager::mailManager(mailManager *this,mailSocket *socket)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->list).super__List_base<FILEINFO_*,_std::allocator<FILEINFO_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->list;
  (this->list).super__List_base<FILEINFO_*,_std::allocator<FILEINFO_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->list;
  (this->list).super__List_base<FILEINFO_*,_std::allocator<FILEINFO_*>_>._M_impl._M_node._M_size = 0
  ;
  if (socket != (mailSocket *)0x0) {
    this->socket = socket;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,anon_var_dwarf_10882,0x16);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(-1);
}

Assistant:

mailManager::mailManager(mailSocket *socket) {
    if (socket != nullptr) {
        this->socket = socket;
    } else {
        std::cerr << "mailSocket未初始化" << std::endl;
        exit(-1);
    }
}